

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O3

void fio_json_on_string(json_parser_s *p,void *start,size_t length)

{
  byte bVar1;
  json_parser_s ary;
  long lVar2;
  json_parser_s str;
  fiobj_object_vtable_s *pfVar3;
  uint8_t *limit64;
  long lVar4;
  ulong *puVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong **ppuVar9;
  ulong uVar10;
  char cVar11;
  ulong *puVar12;
  fio_str_info_s ret;
  ulong *local_78;
  ulong *local_70;
  json_parser_s local_68;
  uint local_5c;
  ulong *local_58;
  uint local_4c;
  fio_str_info_s local_48;
  
  str = (json_parser_s)fiobj_str_buf(length);
  if (str == (json_parser_s)0x0) {
LAB_00161bc1:
    local_48.data = anon_var_dwarf_20c;
    local_48.len = 4;
    goto LAB_00161bd5;
  }
  cVar11 = (char)str.dict;
  if (((ulong)str & 1) != 0) {
    fio_ltocstr(&local_48,(long)str >> 1);
    goto LAB_00161bdb;
  }
  switch(str.dict & 6) {
  case 0:
    cVar11 = *(char *)((ulong)str & 0xfffffffffffffff8);
LAB_00161b4b:
    switch(cVar11) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00161b40_caseD_2;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00161b40_caseD_4;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_00161b40_caseD_2:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_00161b40_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar11 == '&') {
      local_48.data = anon_var_dwarf_217;
      local_48.len = 5;
    }
    else {
      uVar8 = str.dict & 0xff;
      if (uVar8 != 0x16) {
        if (uVar8 == 6) goto LAB_00161bc1;
        goto LAB_00161b4b;
      }
      local_48.data = anon_var_dwarf_222;
      local_48.len = 4;
    }
LAB_00161bd5:
    local_48.capa = 0;
    goto LAB_00161bdb;
  }
  (*pfVar3->to_str)(&local_48,(FIOBJ)str);
LAB_00161bdb:
  local_78 = (ulong *)local_48.data;
  puVar5 = (ulong *)local_48.data;
  if (0 < (long)length) {
    puVar12 = (ulong *)(length + (long)start);
    do {
      while ((start < (ulong *)((long)puVar12 - 7U) &&
             (uVar10 = *start ^ 0xa3a3a3a3a3a3a3a3,
             ((uVar10 & 0x7f7f7f7f7f7f7f7f) + 0x101010101010101 & uVar10 & 0x8080808080808080) == 0)
             )) {
        *puVar5 = *start;
        start = (void *)((long)start + 8);
        puVar5 = puVar5 + 1;
      }
      local_78 = puVar5;
      local_70 = (ulong *)start;
      if (puVar12 <= start) break;
      lVar4 = 0;
      while (*(byte *)((long)start + lVar4) != 0x5c) {
        *(byte *)((long)puVar5 + lVar4) = *(byte *)((long)start + lVar4);
        lVar2 = lVar4 + 1;
        lVar4 = lVar4 + 1;
        if (puVar12 <= (ulong *)((long)start + lVar2)) {
          puVar5 = (ulong *)((long)puVar5 + lVar4);
          goto LAB_001620f3;
        }
      }
      local_78 = (ulong *)((long)puVar5 + lVar4);
      local_70 = (ulong *)((long)start + lVar4 + 1);
      bVar6 = (byte)*local_70;
      if (bVar6 < 0x62) {
        if ((bVar6 - 0x30 < 8) &&
           (bVar1 = *(byte *)((long)start + lVar4 + 2), (bVar1 & 0xf8) == 0x30)) {
          *(char *)((long)puVar5 + lVar4) = bVar1 + bVar6 * '\b' + 'P';
          local_78 = (ulong *)((char *)((long)puVar5 + lVar4) + 1);
          lVar4 = 2;
LAB_00161d0d:
          ppuVar9 = &local_70;
          goto LAB_00161fcb;
        }
        goto switchD_00161d3a_caseD_6f;
      }
      local_58 = local_78;
      switch(bVar6) {
      case 0x6e:
        *(undefined1 *)((long)puVar5 + lVar4) = 10;
        break;
      case 0x72:
        *(undefined1 *)((long)puVar5 + lVar4) = 0xd;
        break;
      case 0x74:
        *(undefined1 *)((long)puVar5 + lVar4) = 9;
        break;
      case 0x75:
        if ((((""[*(byte *)((long)start + lVar4 + 2)] == 0) ||
             (""[*(byte *)((long)start + lVar4 + 3)] == 0)) ||
            (local_5c = (uint)""[*(byte *)((long)start + lVar4 + 4)], local_5c == 0)) ||
           (""[*(byte *)((long)start + lVar4 + 5)] == 0)) goto switchD_00161d3a_caseD_6f;
        uVar7 = ""[*(byte *)((long)start + lVar4 + 5)] - 1 | local_5c * 0x10 - 0x10;
        uVar8 = uVar7 | (""[*(byte *)((long)start + lVar4 + 3)] - 1 |
                        (uint)""[*(byte *)((long)start + lVar4 + 2)] * 0x10 - 0x10) << 8;
        if ((((*(byte *)((long)start + lVar4 + 6) == 0x5c) &&
             (*(byte *)((long)start + lVar4 + 7) == 0x75)) &&
            ((""[*(byte *)((long)start + lVar4 + 8)] != '\0' &&
             ((local_5c = (uint)""[*(byte *)((long)start + lVar4 + 9)], local_5c != 0 &&
              (local_4c = (uint)""[*(byte *)((long)start + lVar4 + 10)], local_4c != 0)))))) &&
           (""[*(byte *)((long)start + lVar4 + 0xb)] != 0)) {
          uVar8 = (uVar8 & 0x3ff) * 0x400 +
                  ((""[*(byte *)((long)start + lVar4 + 0xb)] - 1 | local_4c * 0x10 + 0x3f0 |
                   (local_5c - 1) * 0x100) & 0x3ff) + 0x10000;
          local_70 = (ulong *)((long)start + lVar4 + 7);
LAB_0016208e:
          *(uint *)((long)puVar5 + lVar4) =
               (uVar8 << 0x18 | (uVar8 & 0x3fc0) << 10 | uVar8 >> 0x12 & 0xff | uVar8 >> 4 & 0xff00)
               & 0x3f3f3f07 | 0x808080f0;
          lVar4 = 4;
        }
        else {
          bVar6 = (byte)uVar7;
          if (uVar8 < 0x80) {
            *(byte *)((long)puVar5 + lVar4) = bVar6;
            lVar4 = 1;
          }
          else if (uVar8 < 0x800) {
            *(byte *)((long)puVar5 + lVar4) = (byte)(uVar8 >> 6) | 0xc0;
            *(byte *)((long)puVar5 + lVar4 + 1) = bVar6 & 0x3f | 0x80;
            lVar4 = 2;
          }
          else {
            if (0xffff < uVar8) goto LAB_0016208e;
            *(byte *)((long)puVar5 + lVar4) = (byte)(uVar8 >> 0xc) | 0xe0;
            *(byte *)((long)puVar5 + lVar4 + 1) = (byte)(uVar8 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar5 + lVar4 + 2) = bVar6 & 0x3f | 0x80;
            lVar4 = 3;
          }
        }
        local_78 = (ulong *)((long)local_78 + lVar4);
        lVar4 = 5;
        ppuVar9 = &local_70;
        goto LAB_00161fcb;
      case 0x78:
        if ((""[*(byte *)((long)start + lVar4 + 2)] != '\0') &&
           (""[*(byte *)((long)start + lVar4 + 3)] != '\0')) {
          *(byte *)((long)puVar5 + lVar4) =
               ""[*(byte *)((long)start + lVar4 + 3)] - 1 |
               ""[*(byte *)((long)start + lVar4 + 2)] * '\x10' - 0x10;
          local_78 = (ulong *)((byte *)((long)puVar5 + lVar4) + 1);
          lVar4 = 3;
          goto LAB_00161d0d;
        }
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
switchD_00161d3a_caseD_6f:
        *(byte *)((long)puVar5 + lVar4) = bVar6;
        break;
      default:
        if (bVar6 == 0x66) {
          *(undefined1 *)((long)puVar5 + lVar4) = 0xc;
          local_70 = (ulong *)((long)start + lVar4 + 2);
          lVar4 = 1;
          ppuVar9 = &local_78;
          goto LAB_00161fcb;
        }
        if (bVar6 != 0x62) goto switchD_00161d3a_caseD_6f;
        *(undefined1 *)((long)puVar5 + lVar4) = 8;
      }
      local_70 = (ulong *)((long)start + lVar4 + 2);
      lVar4 = 1;
      ppuVar9 = &local_78;
LAB_00161fcb:
      *ppuVar9 = (ulong *)((long)*ppuVar9 + lVar4);
      puVar5 = local_78;
      start = local_70;
      local_68 = str;
    } while (local_70 < puVar12);
  }
LAB_001620f3:
  fiobj_str_resize((FIOBJ)str,(long)puVar5 - (long)local_48.data);
  ary = p[2];
  if (ary == (json_parser_s)0x0) {
    p[2] = str;
  }
  else if ((char)p[8].dict == '\0') {
    fiobj_ary_push((FIOBJ)ary,(FIOBJ)str);
  }
  else if (p[1] == (json_parser_s)0x0) {
    p[1] = str;
  }
  else {
    fiobj_hash_set((FIOBJ)ary,(FIOBJ)p[1],(FIOBJ)str);
    fiobj_free((FIOBJ)p[1]);
    p[1].dict = 0;
    p[1].depth = '\0';
    p[1].key = '\0';
    *(undefined2 *)&p[1].field_0x6 = 0;
  }
  return;
}

Assistant:

static void fio_json_on_string(json_parser_s *p, void *start, size_t length) {
  FIOBJ str = fiobj_str_buf(length);
  fiobj_str_resize(
      str, fio_json_unescape_str(fiobj_obj2cstr(str).data, start, length));
  fiobj_json_add2parser((fiobj_json_parser_s *)p, str);
}